

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Tjen::Node::Node(Node *this,string *name)

{
  value_type local_25 [13];
  string *local_18;
  string *name_local;
  Node *this_local;
  
  local_18 = name;
  name_local = &this->name;
  std::__cxx11::string::string((string *)this);
  std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::vector
            (&this->transitions);
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,std::deque<char,std::allocator<char>>> *)&this->stack);
  std::__cxx11::string::operator=((string *)this,(string *)name);
  local_25[0] = 'z';
  std::stack<char,_std::deque<char,_std::allocator<char>_>_>::push(&this->stack,local_25);
  return;
}

Assistant:

Tjen::Node::Node(std::string name) {
    this->name = name;
    stack.push('z');

}